

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWriteBarrierManager.cpp
# Opt level: O0

void Memory::RecyclerWriteBarrierManager::ToggleBarrier(void *address,size_t bytes,bool enable)

{
  bool bVar1;
  uintptr_t uVar2;
  void *address_00;
  uintptr_t uVar3;
  ulong local_48;
  uintptr_t i_1;
  uintptr_t i;
  uintptr_t endIndex;
  char *endAddress;
  uintptr_t startIndex;
  bool enable_local;
  size_t bytes_local;
  void *address_local;
  
  if ((Js::Configuration::Global[0x2c154] & 1) != 0) {
    uVar2 = GetCardTableIndex(address);
    address_00 = (void *)Math::Align<long>((long)address + bytes,0x1000);
    uVar3 = GetCardTableIndex(address_00);
    local_48 = uVar2;
    i_1 = uVar2;
    if (enable) {
      for (; i_1 < uVar3; i_1 = i_1 + 1) {
        cardTable[i_1] = cardTable[i_1] | 2;
      }
    }
    else {
      for (; local_48 < uVar3; local_48 = local_48 + 1) {
        cardTable[local_48] = cardTable[local_48] & 0xfd;
      }
    }
    if (((Js::Configuration::Global[0x291a2] & 1) != 0) &&
       (bVar1 = Js::Phases::IsEnabled
                          ((Phases *)(Js::Configuration::Global + 0x23450),MemoryAllocationPhase),
       bVar1)) {
      Output::Print(L"Enabling 0x%p (CIndex: %u-%u)\n",address,uVar2,uVar3);
    }
  }
  return;
}

Assistant:

void
RecyclerWriteBarrierManager::ToggleBarrier(void * address, size_t bytes, bool enable)
{
    if (CONFIG_FLAG(StrictWriteBarrierCheck))
    {
        uintptr_t startIndex = GetCardTableIndex(address);
        char * endAddress = (char *)Math::Align<INT_PTR>((INT_PTR)((char *)address + bytes), s_WriteBarrierPageSize);
        uintptr_t endIndex = GetCardTableIndex(endAddress);
        if (enable)
        {
            for (uintptr_t i = startIndex; i < endIndex; i++)
            {
                cardTable[i] |= WRITE_BARRIER_PAGE_BIT;
            }
        }
        else
        {
            for (uintptr_t i = startIndex; i < endIndex; i++)
            {
                cardTable[i] &= ~WRITE_BARRIER_PAGE_BIT;
            }
        }

        GlobalSwbVerboseTrace(_u("Enabling 0x%p (CIndex: %u-%u)\n"), address, startIndex, endIndex);
    }
}